

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_set_f32_1d(ggml_tensor *tensor,int i,float value)

{
  long lVar1;
  ggml_bf16_t gVar2;
  ulong uVar3;
  int in_ESI;
  undefined4 *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar4 [16];
  int64_t id [4];
  undefined1 local_38 [4];
  float in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ggml_tensor *in_stack_ffffffffffffffe0;
  
  uVar3 = ggml_is_contiguous(in_RDI);
  if ((uVar3 & 1) == 0) {
    memset(local_38,0,0x20);
    ggml_unravel_index(in_RDI,(long)in_ESI,local_38,&stack0xffffffffffffffd0,
                       &stack0xffffffffffffffd8,&stack0xffffffffffffffe0);
    ggml_set_f32_nd(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                    in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    switch(*in_RDI) {
    case 0:
      *(float *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 4) = in_XMM0_Da;
      break;
    case 1:
      auVar4 = vcvtps2ph_f16c(ZEXT416((uint)in_XMM0_Da),0);
      *(short *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 2) = auVar4._0_2_;
      break;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x459,"fatal error");
      break;
    case 0x18:
      *(char *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI) = (char)(int)in_XMM0_Da;
      break;
    case 0x19:
      *(short *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 2) = (short)(int)in_XMM0_Da;
      break;
    case 0x1a:
      *(int *)(*(long *)(in_RDI + 0x3e) + (long)in_ESI * 4) = (int)in_XMM0_Da;
      break;
    case 0x1e:
      lVar1 = *(long *)(in_RDI + 0x3e);
      gVar2 = ggml_compute_fp32_to_bf16(in_XMM0_Da);
      *(uint16_t *)(lVar1 + (long)in_ESI * 2) = gVar2.bits;
    }
  }
  return;
}

Assistant:

void ggml_set_f32_1d(const struct ggml_tensor * tensor, int i, float value) {
    if (!ggml_is_contiguous(tensor)) {
        int64_t id[4] = { 0, 0, 0, 0 };
        ggml_unravel_index(tensor, i, &id[0], &id[1], &id[2], &id[3]);
        ggml_set_f32_nd(tensor, id[0], id[1], id[2], id[3], value);
        return;
    }
    switch (tensor->type) {
        case GGML_TYPE_I8:
            {
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_BF16:
            {
                ((ggml_bf16_t *)(tensor->data))[i] = GGML_FP32_TO_BF16(value);
            } break;
        case GGML_TYPE_F32:
            {
                ((float *)(tensor->data))[i] = value;
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}